

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkpar.c
# Opt level: O3

void make_parser(void)

{
  action *paVar1;
  ulong uVar2;
  long lVar3;
  
  parser = (action **)allocate(nstates << 3);
  if (0 < nstates) {
    lVar3 = 0;
    do {
      paVar1 = get_shifts((int)lVar3);
      paVar1 = add_reductions((int)lVar3,paVar1);
      parser[lVar3] = paVar1;
      lVar3 = lVar3 + 1;
    } while (lVar3 < nstates);
  }
  uVar2 = (ulong)(uint)(*shift_table)->nshifts;
  do {
    if ((int)uVar2 < 1) break;
    final_state = (*shift_table)->shift[uVar2 - 1];
    uVar2 = uVar2 - 1;
  } while (accessing_symbol[final_state] != ritem[1]);
  remove_conflicts();
  unused_rules();
  if (RRtotal + SRtotal != 0 && SCARRY4(RRtotal,SRtotal) == RRtotal + SRtotal < 0) {
    total_conflicts();
  }
  defreds();
  return;
}

Assistant:

void make_parser()
{
    register int i;

    parser = NEW2(nstates, action *);
    for (i = 0; i < nstates; i++)
	parser[i] = parse_actions(i);

    find_final_state();
    remove_conflicts();
    unused_rules();
    if (SRtotal + RRtotal > 0) total_conflicts();
    defreds();
}